

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O3

void Tim_ManCreate(Tim_Man_t *p,void *pLib,Vec_Flt_t *vInArrs,Vec_Flt_t *vOutReqs)

{
  uint uVar1;
  void *pvVar2;
  Tim_Obj_t *pTVar3;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  float *pfVar9;
  undefined8 *puVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  if (p->vDelayTables != (Vec_Ptr_t *)0x0) {
    __assert_fail("p->vDelayTables == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                  ,0x19e,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)");
  }
  if (pLib == (void *)0x0) {
    pVVar7 = (Vec_Ptr_t *)malloc(0x10);
    pVVar7->nCap = 100;
    pVVar7->nSize = 0;
    ppvVar8 = (void **)malloc(800);
    pVVar7->pArray = ppvVar8;
  }
  else {
    iVar6 = *(int *)(*(long *)((long)pLib + 8) + 4);
    pVVar7 = (Vec_Ptr_t *)malloc(0x10);
    iVar5 = 8;
    if (6 < iVar6 - 1U) {
      iVar5 = iVar6;
    }
    pVVar7->nCap = iVar5;
    if (iVar5 == 0) {
      ppvVar8 = (void **)0x0;
    }
    else {
      ppvVar8 = (void **)malloc((long)iVar5 << 3);
    }
    pVVar7->pArray = ppvVar8;
    pVVar7->nSize = iVar6;
    memset(ppvVar8,0,(long)iVar6 << 3);
  }
  p->vDelayTables = pVVar7;
  pVVar7 = p->vBoxes;
  if (pVVar7 == (Vec_Ptr_t *)0x0) {
    if (vInArrs == (Vec_Flt_t *)0x0) goto LAB_004a1d2b;
    iVar6 = vInArrs->nSize;
LAB_004a1cd8:
    iVar5 = p->nCis;
  }
  else {
    if (0 < pVVar7->nSize) {
      lVar14 = 0;
      do {
        pvVar2 = pVVar7->pArray[lVar14];
        uVar1 = *(uint *)((long)pvVar2 + 0x10);
        uVar12 = (ulong)uVar1;
        if ((pLib == (void *)0x0) || (uVar1 == 0xffffffff)) {
          iVar6 = *(int *)((long)pvVar2 + 8);
          iVar5 = *(int *)((long)pvVar2 + 0xc);
          uVar15 = iVar5 * iVar6;
          puVar10 = (undefined8 *)malloc((long)(int)uVar15 * 4 + 0xc);
          auVar4 = _DAT_0093d220;
          *puVar10 = CONCAT44((float)iVar6,(float)(int)uVar1);
          *(float *)(puVar10 + 1) = (float)iVar5;
          if (0 < (int)uVar15) {
            lVar11 = (ulong)uVar15 - 1;
            auVar16._8_4_ = (int)lVar11;
            auVar16._0_8_ = lVar11;
            auVar16._12_4_ = (int)((ulong)lVar11 >> 0x20);
            auVar16 = auVar16 ^ auVar4;
            uVar12 = 0;
            auVar17 = _DAT_0093d210;
            auVar18 = _DAT_0093e4e0;
            do {
              auVar19 = auVar17 ^ auVar4;
              iVar6 = auVar16._4_4_;
              if ((bool)(~(auVar19._4_4_ == iVar6 && auVar16._0_4_ < auVar19._0_4_ ||
                          iVar6 < auVar19._4_4_) & 1)) {
                *(undefined4 *)((long)puVar10 + uVar12 * 4 + 0xc) = 0x3f800000;
              }
              if ((auVar19._12_4_ != auVar16._12_4_ || auVar19._8_4_ <= auVar16._8_4_) &&
                  auVar19._12_4_ <= auVar16._12_4_) {
                *(undefined4 *)((long)puVar10 + uVar12 * 4 + 0x10) = 0x3f800000;
              }
              iVar5 = SUB164(auVar18 ^ auVar4,4);
              if (iVar5 <= iVar6 && (iVar5 != iVar6 || SUB164(auVar18 ^ auVar4,0) <= auVar16._0_4_))
              {
                *(undefined4 *)((long)puVar10 + uVar12 * 4 + 0x14) = 0x3f800000;
                *(undefined4 *)((long)puVar10 + uVar12 * 4 + 0x18) = 0x3f800000;
              }
              uVar12 = uVar12 + 4;
              lVar11 = auVar17._8_8_;
              auVar17._0_8_ = auVar17._0_8_ + 4;
              auVar17._8_8_ = lVar11 + 4;
              lVar11 = auVar18._8_8_;
              auVar18._0_8_ = auVar18._0_8_ + 4;
              auVar18._8_8_ = lVar11 + 4;
            } while ((uVar15 + 3 & 0xfffffffc) != uVar12);
          }
          pVVar7 = p->vDelayTables;
          uVar1 = pVVar7->nSize;
          *(uint *)((long)pvVar2 + 0x10) = uVar1;
          if (uVar1 == pVVar7->nCap) {
            if ((int)uVar1 < 0x10) {
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(0x80);
              }
              else {
                ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
              }
              pVVar7->pArray = ppvVar8;
              pVVar7->nCap = 0x10;
            }
            else {
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar1 << 4);
              }
              pVVar7->pArray = ppvVar8;
              pVVar7->nCap = uVar1 * 2;
            }
          }
          else {
            ppvVar8 = pVVar7->pArray;
          }
          iVar6 = pVVar7->nSize;
          pVVar7->nSize = iVar6 + 1;
          ppvVar8[iVar6] = puVar10;
        }
        else {
          if (((int)uVar1 < 0) || (*(int *)(*(long *)((long)pLib + 8) + 4) <= (int)uVar1)) {
            __assert_fail("pBox->iDelayTable >= 0 && pBox->iDelayTable < Vec_PtrSize(pLibBox->vBoxes)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                          ,0x1b1,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)"
                         );
          }
          lVar11 = *(long *)(*(long *)(*(long *)((long)pLib + 8) + 8) + uVar12 * 8);
          if (lVar11 == 0) {
            __assert_fail("pIfBox != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                          ,0x1b3,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)"
                         );
          }
          iVar6 = *(int *)(lVar11 + 0x10);
          if (iVar6 != *(int *)((long)pvVar2 + 8)) {
            __assert_fail("pIfBox->nPis == pBox->nInputs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                          ,0x1b4,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)"
                         );
          }
          iVar5 = *(int *)(lVar11 + 0x14);
          if (iVar5 != *(int *)((long)pvVar2 + 0xc)) {
            __assert_fail("pIfBox->nPos == pBox->nOutputs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                          ,0x1b5,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)"
                         );
          }
          *(int *)((long)pvVar2 + 0x18) = (int)*(char *)(lVar11 + 9);
          if (p->vDelayTables->nSize <= (int)uVar1) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          ppvVar8 = p->vDelayTables->pArray;
          if (ppvVar8[uVar12] == (void *)0x0) {
            uVar15 = iVar5 * iVar6;
            pfVar9 = (float *)malloc((long)(int)uVar15 * 4 + 0xc);
            *pfVar9 = (float)(int)uVar1;
            *(ulong *)(pfVar9 + 1) = CONCAT44((float)iVar5,(float)iVar6);
            if (0 < (int)uVar15) {
              lVar11 = *(long *)(lVar11 + 0x18);
              uVar13 = 0;
              do {
                pfVar9[uVar13 + 3] = (float)*(int *)(lVar11 + uVar13 * 4);
                uVar13 = uVar13 + 1;
              } while (uVar15 != uVar13);
            }
            ppvVar8[uVar12] = pfVar9;
          }
        }
        lVar14 = lVar14 + 1;
        pVVar7 = p->vBoxes;
      } while (lVar14 < pVVar7->nSize);
    }
    if (vInArrs == (Vec_Flt_t *)0x0) goto LAB_004a1d2b;
    iVar6 = vInArrs->nSize;
    if ((pVVar7 == (Vec_Ptr_t *)0x0) || (pVVar7->nSize == 0)) goto LAB_004a1cd8;
    iVar5 = Tim_ManBoxOutputFirst(p,0);
  }
  if (iVar6 != iVar5) {
    __assert_fail("Vec_FltSize(vInArrs) == Tim_ManPiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                  ,0x1c6,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)");
  }
  uVar1 = p->nCis;
  if ((0 < (int)uVar1) && (p->pCis != (Tim_Obj_t *)0x0)) {
    pfVar9 = &p->pCis->timeArr;
    uVar12 = 0;
    do {
      if ((int)pfVar9[-2] < 0) {
        if ((long)vInArrs->nSize <= (long)uVar12) goto LAB_004a1dd4;
        *pfVar9 = vInArrs->pArray[uVar12];
      }
      uVar12 = uVar12 + 1;
      pfVar9 = pfVar9 + 6;
    } while (uVar1 != uVar12);
  }
LAB_004a1d2b:
  if (vOutReqs != (Vec_Flt_t *)0x0) {
    iVar6 = vOutReqs->nSize;
    iVar5 = Tim_ManPoNum(p);
    if (iVar6 != iVar5) {
      __assert_fail("Vec_FltSize(vOutReqs) == Tim_ManPoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                    ,0x1cf,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)");
    }
    iVar6 = p->nCos;
    if ((long)iVar6 < 1) {
LAB_004a1d94:
      iVar5 = 0;
    }
    else {
      pTVar3 = p->pCos;
      lVar14 = 0;
      uVar12 = 0;
      do {
        if (pTVar3 == (Tim_Obj_t *)0x0) goto LAB_004a1d94;
        uVar13 = uVar12;
        if (*(int *)((long)&pTVar3->iObj2Box + lVar14) < 0) {
          iVar5 = (int)uVar12;
          if ((iVar5 < 0) || (vOutReqs->nSize <= iVar5)) {
LAB_004a1dd4:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                          ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
          }
          uVar13 = (ulong)(iVar5 + 1);
          *(float *)((long)&pTVar3->timeReq + lVar14) = vOutReqs->pArray[uVar12];
        }
        iVar5 = (int)uVar13;
        lVar14 = lVar14 + 0x18;
        uVar12 = uVar13;
      } while ((long)iVar6 * 0x18 != lVar14);
    }
    iVar6 = Tim_ManPoNum(p);
    if (iVar5 != iVar6) {
      __assert_fail("k == Tim_ManPoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                    ,0x1d2,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)");
    }
  }
  return;
}

Assistant:

void Tim_ManCreate( Tim_Man_t * p, void * pLib, Vec_Flt_t * vInArrs, Vec_Flt_t * vOutReqs )
{
    If_LibBox_t * pLibBox = (If_LibBox_t *)pLib;
    If_Box_t * pIfBox;
    Tim_Box_t * pBox;
    Tim_Obj_t * pObj;
    float * pTable;
    int i, k;
    assert( p->vDelayTables == NULL );
    p->vDelayTables = pLibBox ? Vec_PtrStart( Vec_PtrSize(pLibBox->vBoxes) ) : Vec_PtrAlloc( 100 );
    if ( p->vBoxes )
    Tim_ManForEachBox( p, pBox, i )
    {
        if ( pBox->iDelayTable == -1 || pLibBox == NULL )
        {
            // create table with constants
            pTable = ABC_ALLOC( float, 3 + pBox->nInputs * pBox->nOutputs );
            pTable[0] = pBox->iDelayTable;
            pTable[1] = pBox->nInputs;
            pTable[2] = pBox->nOutputs;
            for ( k = 0; k < pBox->nInputs * pBox->nOutputs; k++ )
                pTable[3 + k] = 1.0;
            // save table
            pBox->iDelayTable = Vec_PtrSize(p->vDelayTables);
            Vec_PtrPush( p->vDelayTables, pTable );
            continue;
        }
        assert( pBox->iDelayTable >= 0 && pBox->iDelayTable < Vec_PtrSize(pLibBox->vBoxes) );
        pIfBox = (If_Box_t *)Vec_PtrEntry( pLibBox->vBoxes, pBox->iDelayTable );
        assert( pIfBox != NULL );
        assert( pIfBox->nPis == pBox->nInputs );
        assert( pIfBox->nPos == pBox->nOutputs );
        pBox->fBlack = pIfBox->fBlack;
        if ( Vec_PtrEntry( p->vDelayTables, pBox->iDelayTable ) != NULL )
            continue;
        // create table of boxes
        pTable = ABC_ALLOC( float, 3 + pBox->nInputs * pBox->nOutputs );
        pTable[0] = pBox->iDelayTable;
        pTable[1] = pBox->nInputs;
        pTable[2] = pBox->nOutputs;
        for ( k = 0; k < pBox->nInputs * pBox->nOutputs; k++ )
            pTable[3 + k] = pIfBox->pDelays[k];
        // save table
        Vec_PtrWriteEntry( p->vDelayTables, pBox->iDelayTable, pTable );
    }
    // create arrival times
    if ( vInArrs )
    {
        assert( Vec_FltSize(vInArrs) == Tim_ManPiNum(p) );
        Tim_ManForEachPi( p, pObj, i )
            pObj->timeArr = Vec_FltEntry(vInArrs, i);

    }
    // create required times
    if ( vOutReqs )
    {
        k = 0;
        assert( Vec_FltSize(vOutReqs) == Tim_ManPoNum(p) );
        Tim_ManForEachPo( p, pObj, i )
            pObj->timeReq = Vec_FltEntry(vOutReqs, k++);
        assert( k == Tim_ManPoNum(p) );
    }
}